

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SetText
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr pszSrc,size_t offset,
          size_t length,charcount_t charOffset,bool isUtf8,ULONG grfscr,ULONG lineNumber)

{
  OLECHAR OVar1;
  byte *last;
  DecodeOptions DVar2;
  byte *local_38;
  
  this->m_pchBase = pszSrc;
  local_38 = pszSrc + offset;
  last = local_38 + length;
  this->m_pchLast = last;
  this->m_pchMinTok = local_38;
  this->m_pchMinLine = local_38;
  this->m_currentCharacter = local_38;
  this->m_pchPrevLine = local_38;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = offset - charOffset;
  if (offset == 0) {
    if (local_38 < last) {
      OVar1 = (OLECHAR)*local_38;
    }
    else {
      OVar1 = L'\0';
    }
    if (0x7f < (ushort)OVar1) {
      OVar1 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                        (&this->super_UTF8EncodingPolicyBase<false>,&local_38,last);
    }
    if ((OVar1 == L'￮') || (OVar1 == L'\xfeff')) {
      UTF8EncodingPolicyBase<false>::ReadFull<true>
                (&this->super_UTF8EncodingPolicyBase<false>,&this->m_currentCharacter,
                 this->m_pchLast);
    }
  }
  this->m_line = lineNumber;
  this->m_startLine = lineNumber;
  this->m_pchStartLine = this->m_currentCharacter;
  this->m_ptoken->tk = tkNone;
  this->m_fHadEol = 0;
  this->field_0x508 = this->field_0x508 & 0x3e | (byte)(grfscr >> 0xd) & 1;
  DVar2 = doAllowThreeByteSurrogates;
  if (isUtf8) {
    DVar2 = doAllowInvalidWCHARs;
  }
  (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions =
       DVar2 | (this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions &
               ~(doAllowInvalidWCHARs|doAllowThreeByteSurrogates);
  return;
}

Assistant:

void Scanner<EncodingPolicy>::SetText(EncodedCharPtr pszSrc, size_t offset, size_t length, charcount_t charOffset, bool isUtf8, ULONG grfscr, ULONG lineNumber)
{
    // Save the start of the script and add the offset to get the point where we should start scanning.
    m_pchBase = pszSrc;
    m_pchLast = m_pchBase + offset + length;
    m_pchPrevLine = m_currentCharacter = m_pchMinLine = m_pchMinTok = pszSrc + offset;

    this->RestoreMultiUnits(offset - charOffset);

    // Absorb any byte order mark at the start
    if(offset == 0)
    {
        switch( this->PeekFull(m_currentCharacter, m_pchLast) )
        {
        case 0xFFEE:    // "Opposite" endian BOM
            // We do not support big-endian encodings
            // fall-through

        case 0xFEFF:    // "Correct" BOM
            this->template ReadFull<true>(m_currentCharacter, m_pchLast);
            break;
        }
    }

    m_line = lineNumber;
    m_startLine = lineNumber;
    m_pchStartLine = m_currentCharacter;
    m_ptoken->tk = tkNone;
    m_fIsModuleCode = (grfscr & fscrIsModuleCode) != 0;
    m_fHadEol = FALSE;
    m_DeferredParseFlags = ScanFlagNone;

    this->SetIsUtf8(isUtf8);
}